

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

int __thiscall rcg::Stream::open(Stream *this,char *__file,int __oflag,...)

{
  GC_ERROR GVar1;
  int extraout_EAX;
  element_type *peVar2;
  void *pvVar3;
  element_type *peVar4;
  char *pcVar5;
  undefined8 uVar6;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000560;
  string *in_stack_00000568;
  GenTLException *in_stack_00000570;
  mutex_type *in_stack_ffffffffffffff48;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff50;
  allocator *paVar7;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  GenTLException *in_stack_ffffffffffffff70;
  PDevOpenDataStream p_Var8;
  allocator local_69;
  string local_68 [38];
  undefined1 local_42;
  allocator local_41;
  string local_40 [56];
  Stream *local_8;
  
  local_8 = this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (this->n_open == 0) {
    peVar2 = std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11fb30);
    pvVar3 = Device::getHandle(peVar2);
    if (pvVar3 == (void *)0x0) {
      uVar6 = __cxa_allocate_exception(0x28);
      paVar7 = &local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,
                 "Stream::open(): Device must be opened before open before opening a stream",paVar7)
      ;
      GenTLException::GenTLException
                (in_stack_ffffffffffffff70,
                 (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      __cxa_throw(uVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11fb5c);
    p_Var8 = peVar4->DevOpenDataStream;
    peVar2 = std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11fb76);
    pvVar3 = Device::getHandle(peVar2);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    GVar1 = (*p_Var8)(pvVar3,pcVar5,&this->stream);
    if (GVar1 != 0) {
      local_42 = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Stream::open()",&local_41);
      GenTLException::GenTLException(in_stack_00000570,in_stack_00000568,in_stack_00000560);
      local_42 = 0;
      __cxa_throw(uVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  this->n_open = this->n_open + 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x11fd8c);
  return extraout_EAX;
}

Assistant:

void Stream::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (parent->getHandle() != 0)
    {
      if (gentl->DevOpenDataStream(parent->getHandle(), id.c_str(), &stream) !=
          GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Stream::open()", gentl);
      }
    }
    else
    {
      throw GenTLException("Stream::open(): Device must be opened before open before opening a stream");
    }
  }

  n_open++;
}